

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject> *this,ProgramReader *x)

{
  bool bVar1;
  ProgramReader *pPVar2;
  _func_int **pp_Var3;
  ProgramReader *in_RSI;
  ProgramReader *in_RDI;
  DeleteObject deleter;
  
  pPVar2 = get((SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject> *)0x11f656);
  if ((in_RSI != pPVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject> *)0x11f66c),
     bVar1)) {
    release((SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject> *)in_RSI);
    DeleteObject::operator()((DeleteObject *)in_RSI,in_RDI);
  }
  pp_Var3 = (_func_int **)
            set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  in_RDI->_vptr_ProgramReader = pp_Var3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}